

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O2

void set_pstate_bits(TCGContext_conflict1 *tcg_ctx,uint32_t bits)

{
  TCGv_i32 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0x148);
  tcg_gen_ori_i32_aarch64(tcg_ctx,ret,ret,bits);
  tcg_gen_st_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0x148);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static inline void set_pstate_bits(TCGContext *tcg_ctx, uint32_t bits)
{
    TCGv_i32 p = tcg_temp_new_i32(tcg_ctx);

    tcg_debug_assert(!(bits & CACHED_PSTATE_BITS));

    tcg_gen_ld_i32(tcg_ctx, p, tcg_ctx->cpu_env, offsetof(CPUARMState, pstate));
    tcg_gen_ori_i32(tcg_ctx, p, p, bits);
    tcg_gen_st_i32(tcg_ctx, p, tcg_ctx->cpu_env, offsetof(CPUARMState, pstate));
    tcg_temp_free_i32(tcg_ctx, p);
}